

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.h
# Opt level: O0

void crnlib::utils::endian_swap_mem16(uint16 *p,uint n)

{
  uint n_local;
  uint16 *p_local;
  
  n_local = n;
  p_local = p;
  while (n_local != 0) {
    *p_local = *p_local << 8 | *p_local >> 8;
    p_local = p_local + 1;
    n_local = n_local - 1;
  }
  return;
}

Assistant:

inline void endian_swap_mem16(uint16* p, uint n) {
  while (n--) {
    *p = swap16(*p);
    ++p;
  }
}